

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

void internal_twin_messenger_destroy(TWIN_MESSENGER_INSTANCE_conflict *twin_msgr)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  if (twin_msgr->amqp_msgr != (AMQP_MESSENGER_HANDLE)0x0) {
    amqp_messenger_destroy(twin_msgr->amqp_msgr);
  }
  if (twin_msgr->pending_patches != (SINGLYLINKEDLIST_HANDLE)0x0) {
    iVar1 = singlylinkedlist_remove_if
                      (twin_msgr->pending_patches,cancel_pending_twin_patch_operation,twin_msgr);
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"internal_twin_messenger_destroy",0x51c,1,
                  "Failed removing pending desired properties PATCH operation (%s)",
                  twin_msgr->device_id);
      }
    }
    singlylinkedlist_destroy(twin_msgr->pending_patches);
  }
  if (twin_msgr->operations != (SINGLYLINKEDLIST_HANDLE)0x0) {
    singlylinkedlist_remove_if(twin_msgr->operations,cancel_all_pending_twin_operations,twin_msgr);
    singlylinkedlist_destroy(twin_msgr->operations);
  }
  if (twin_msgr->device_id != (char *)0x0) {
    free(twin_msgr->device_id);
  }
  if (twin_msgr->module_id != (char *)0x0) {
    free(twin_msgr->module_id);
  }
  if (twin_msgr->iothub_host_fqdn != (char *)0x0) {
    free(twin_msgr->iothub_host_fqdn);
  }
  free(twin_msgr);
  return;
}

Assistant:

static void internal_twin_messenger_destroy(TWIN_MESSENGER_INSTANCE* twin_msgr)
{
    if (twin_msgr->amqp_msgr != NULL)
    {
        amqp_messenger_destroy(twin_msgr->amqp_msgr);
    }

    if (twin_msgr->pending_patches != NULL)
    {
        if (singlylinkedlist_remove_if(twin_msgr->pending_patches, cancel_pending_twin_patch_operation, twin_msgr) != 0)
        {
            LogError("Failed removing pending desired properties PATCH operation (%s)", twin_msgr->device_id);
        }

        singlylinkedlist_destroy(twin_msgr->pending_patches);
    }

    if (twin_msgr->operations != NULL)
    {
        singlylinkedlist_remove_if(twin_msgr->operations, cancel_all_pending_twin_operations, (const void*)twin_msgr);
        singlylinkedlist_destroy(twin_msgr->operations);
    }

    if (twin_msgr->device_id != NULL)
    {
        free(twin_msgr->device_id);
    }

    if (twin_msgr->module_id != NULL)
    {
        free(twin_msgr->module_id);
    }

    if (twin_msgr->iothub_host_fqdn != NULL)
    {
        free(twin_msgr->iothub_host_fqdn);
    }

    free(twin_msgr);
}